

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::integrate
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,size_t Nintegral)

{
  ulong uVar1;
  double *pdVar2;
  double dVar3;
  undefined8 *puVar4;
  invalid_argument *this_00;
  Index index;
  ulong uVar5;
  ulong uVar6;
  Index index_1;
  ulong uVar7;
  double dVar8;
  double dVar9;
  vectype local_38;
  
  if (Nintegral != 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Only support one integral for now");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar1 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if ((long)uVar1 < -1) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar7 = uVar1 + 1;
  if (uVar7 == 0) {
LAB_0010a539:
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  if (uVar7 < 0x2000000000000000) {
    local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)malloc(uVar7 * 8);
    if ((uVar1 != 0) &&
       (((ulong)local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data & 0xf) != 0)) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                    ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      dVar8 = this->m_xmax - this->m_xmin;
      local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar7;
      if (uVar1 == 0) {
        *local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             0.0;
        uVar6 = 0;
      }
      else {
        pdVar2 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar6 = 1;
        do {
          if (uVar6 == 1) {
            if (uVar1 < 3) {
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0xa3,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                           );
            }
            local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [1] = ((*pdVar2 + *pdVar2) - pdVar2[2]) * 0.5;
            uVar6 = 2;
          }
          else {
            if (uVar6 + 1 < uVar1) {
              dVar9 = pdVar2[uVar6 - 1] - pdVar2[uVar6 + 1];
            }
            else {
              if ((long)uVar1 < (long)uVar6) {
                __assert_fail("index >= 0 && index < size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                              ,0x19a,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                             );
              }
              dVar9 = pdVar2[uVar6 - 1];
            }
            local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar6] = dVar9 / (double)((int)uVar6 * 2);
            uVar6 = uVar6 + 1;
          }
        } while ((long)uVar6 <= (long)uVar1);
        if (uVar7 == 0) goto LAB_0010a539;
        *local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             0.0;
        dVar9 = dVar8 * 0.5;
        uVar6 = uVar7 & 0x1ffffffffffffffe;
        uVar5 = 0;
        do {
          dVar3 = (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data + uVar5)[1];
          local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar5] = local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar5] * dVar9;
          (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          + uVar5)[1] = dVar3 * dVar9;
          uVar5 = uVar5 + 2;
        } while (uVar5 < uVar6);
      }
      if ((long)uVar6 <= (long)uVar1) {
        do {
          local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar6] = local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar6] * dVar8 * 0.5;
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      ChebyshevExpansion(__return_storage_ptr__,&local_38,this->m_xmin,this->m_xmax);
      free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      return __return_storage_ptr__;
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = operator_new;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::integrate(std::size_t Nintegral) const {
        // See Mason and Handscomb, p. 33, Eq. 2.44 & 2.45
        // and example in https ://github.com/numpy/numpy/blob/master/numpy/polynomial/chebyshev.py#L868-L964
        if (Nintegral != 1) { throw std::invalid_argument("Only support one integral for now"); }
        vectype c(m_c.size() + 1);
        double width = m_xmax - m_xmin;
        for (auto i = 1; i < m_c.size()+1; ++i) {
            if (i == 1) {
                // This special case is needed because the prime on the summation in Mason indicates the first coefficient 
                // is to be divided by two
                c[i] = (2*m_c[i - 1] - m_c[i + 1]) / (2 * i);
            }
            else if (i + 1 > m_c.size()-1) {
                c[i] = (m_c[i - 1]) / (2 * i);
            }
            else {
                c[i] = (m_c[i - 1] - m_c[i + 1]) / (2 * i);
            }
        }
        c(0) = 0; // This is the arbitrary constant;
        c *= width / 2;
        return ChebyshevExpansion(std::move(c), m_xmin, m_xmax);
    }